

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O2

void __thiscall params::params(params *this,int argc,char **argv)

{
  char *__first;
  int iVar1;
  size_t sVar2;
  invalid_argument *piVar3;
  ostream *poVar4;
  option *poVar5;
  undefined8 uVar6;
  __integer_from_chars_result_type<unsigned_int> _Var7;
  allocator<char> local_1e5;
  uint i;
  char *local_1e0;
  _List_iterator<int> local_1d8;
  ulong local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  int capacity;
  
  this->measure = 0;
  this->max_steps = 100;
  this->help_required = false;
  local_1d8._M_node = (_List_node_base *)&this->capacities;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = local_1d8._M_node;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = local_1d8._M_node;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  local_1e0 = (char *)0x0;
  local_1d0 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            poVar5 = params::long_options;
            iVar1 = getopt_long(argc,argv,"a:m:s:h",params::long_options,0);
            __first = _optarg;
            if (iVar1 != 0x61) break;
            capacity = anon_unknown.dwarf_de86::parse<int>(_optarg);
            if (capacity < 1) {
              piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar3,"Bucket capacity must be greater than 0");
              __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            std::__cxx11::list<int,std::allocator<int>>::emplace_back<int&>
                      ((list<int,std::allocator<int>> *)local_1d8._M_node,&capacity);
          }
          if (iVar1 != 0x68) break;
          this->help_required = true;
        }
        if (iVar1 == -1) {
          if (_optind < argc) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&capacity);
            std::operator<<((ostream *)&capacity,"invalid argument: ");
            for (; _optind < argc; _optind = _optind + 1) {
              poVar4 = std::operator<<((ostream *)&capacity,argv[_optind]);
              std::operator<<(poVar4,' ');
            }
            piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::invalid_argument::invalid_argument(piVar3,(string *)&local_1c8);
            __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          if (this->help_required != false) {
            return;
          }
          if ((local_1d8._M_node)->_M_next == local_1d8._M_node) {
            piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar3,"No buckets were added");
          }
          else {
            iVar1 = std::accumulate<std::_List_iterator<int>,int>
                              ((local_1d8._M_node)->_M_next,local_1d8,0);
            if (this->measure <= iVar1) {
              return;
            }
            piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar3,"Required measurement exceeds total bucket capacity");
          }
          __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        if (iVar1 != 0x6d) break;
        if ((local_1d0 & 1) != 0) {
          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar3,"Measurement was already specified");
          goto LAB_001050f7;
        }
        iVar1 = anon_unknown.dwarf_de86::parse<int>(_optarg);
        this->measure = iVar1;
        local_1d0 = CONCAT71((int7)((ulong)poVar5 >> 8),1);
        if (iVar1 < 1) {
          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar3,"Invalid measurement, must be greater than 0");
          goto LAB_001050f7;
        }
      }
      if (iVar1 == 0x73) break;
      if (iVar1 == 0x3f) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar3,"Invalid argument");
        goto LAB_001050f7;
      }
    }
    if (((ulong)local_1e0 & 1) != 0) break;
    i = 0;
    sVar2 = strlen(_optarg);
    local_1e0 = __first;
    uVar6 = 0;
    _Var7 = std::from_chars<unsigned_int>(__first,__first + sVar2,&i,10);
    if (*_Var7.ptr != '\0') {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Invalid argument: ",&local_1e5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&capacity,
                     &local_1c8,local_1e0);
      std::invalid_argument::invalid_argument(piVar3,(string *)&capacity);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    this->max_steps = i;
    local_1e0 = (char *)CONCAT71((int7)((ulong)uVar6 >> 8),1);
    if (i == 0) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"Invalid maximum number of steps");
LAB_001050f7:
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Max number of steps already specified");
  goto LAB_001050f7;
}

Assistant:

params::params(const int argc, char* argv[])
{
	bool measurement_specified = false;
	bool max_steps_specified = false;

	while (true) {
		static option long_options[] = {
			{"add-bucket", true, nullptr, 'a'},
			{"measure", true, nullptr, 'm'},
			{"max-steps", true, nullptr, 's'},
			{"help", false, nullptr, 'h'},
			{nullptr, false, nullptr, 0}
		};

		int c = getopt_long(argc, argv, "a:m:s:h", long_options, nullptr);
		if (c == -1)
			break;

		switch (c) {
		case 'a' : {
			int capacity = parse<int>(optarg);
			if (capacity < 1)
				throw std::invalid_argument{
					"Bucket capacity must be greater than 0"};
			capacities.emplace_back(capacity);
			break;
		}
		case 'm' : {
			if (measurement_specified)
				throw std::invalid_argument{
					"Measurement was already specified"};
			measurement_specified = true;
			measure = parse<int>(optarg);
			if (measure < 1)
				throw std::invalid_argument{
					"Invalid measurement, must be greater than 0"};
			break;
		}
		case 's' : {
			if (max_steps_specified)
				throw std::invalid_argument{
					"Max number of steps already specified"};
			max_steps_specified = true;
			max_steps = parse<unsigned>(optarg);
			if (max_steps < 1)
				throw std::invalid_argument{
					"Invalid maximum number of steps"};
			break;
		}
		case 'h' :
			help_required = true;
			break;
		case '?' :
			throw std::invalid_argument{"Invalid argument"};
			break;
		}
	}

	if (optind < argc) {
		std::ostringstream oss;
		oss << "invalid argument: ";
		for (; optind < argc; ++optind)
			oss << argv[optind] << ' ';
		throw std::invalid_argument{oss.str()};
	}

	if (!help_required) {
		try {
			if (capacities.empty())
				throw std::invalid_argument{"No buckets were added"};
			if (std::accumulate(capacities.begin(), capacities.end(), 0) < measure)
				throw std::invalid_argument{
					"Required measurement exceeds total bucket capacity"};
		}
		catch (const std::exception& e) {
			help_required = true;
			std::ostringstream oss;
			oss << e.what() << "\n\n" << help;
			throw std::invalid_argument{oss.str()};
		}
	}
}